

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastHugeDecimalToNumeric<duckdb::hugeint_t>
          (duckdb *this,hugeint_t input,hugeint_t *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  ulong uVar2;
  hugeint_t hVar3;
  hugeint_t power;
  hugeint_t rounding;
  hugeint_t local_78;
  hugeint_t local_68;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t local_28;
  
  local_58.upper = input.lower;
  uVar2 = (ulong)(uint)((int)parameters << 4);
  local_68.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar2);
  local_68.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar2 + 8);
  local_58.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_38,0);
  bVar1 = hugeint_t::operator<(&local_58,&local_38);
  if (bVar1) {
    local_78 = hugeint_t::operator-(&local_68);
  }
  else {
    local_78.upper = local_68.upper;
    local_78.lower = local_68.lower;
  }
  hugeint_t::hugeint_t(&local_48,2);
  local_28 = hugeint_t::operator/(&local_78,&local_48);
  local_78 = hugeint_t::operator+(&local_58,&local_28);
  hVar3 = hugeint_t::operator/(&local_78,&local_68);
  *(hugeint_t *)input.upper = hVar3;
  return true;
}

Assistant:

bool TryCastHugeDecimalToNumeric(hugeint_t input, DST &result, CastParameters &parameters, uint8_t scale) {
	const auto power = Hugeint::POWERS_OF_TEN[scale];
	const auto rounding = ((input < 0) ? -power : power) / 2;
	auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<hugeint_t, DST>(scaled_value, result)) {
		string error = StringUtil::Format("Failed to cast decimal value %s to type %s",
		                                  ConvertToString::Operation(scaled_value), GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}